

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_json
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,bool as_key,bool use_quotes)

{
  size_t *psVar1;
  char cVar2;
  code *pcVar3;
  bool bVar4;
  error_flags eVar5;
  int iVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  char *pcVar8;
  undefined3 in_register_00000081;
  ulong uVar9;
  size_t sVar10;
  size_t *psVar11;
  basic_substring<const_char> local_50;
  basic_substring<const_char> local_40;
  
  local_50.len = s.len;
  local_50.str = s.str;
  if (((int)CONCAT71(in_register_00000009,as_key) == 0 &&
       CONCAT31(in_register_00000081,use_quotes) == 0) &&
     ((((iVar6 = basic_substring<const_char>::compare(&local_50,"true",4), iVar6 == 0 ||
        (iVar6 = basic_substring<const_char>::compare(&local_50,"false",5), iVar6 == 0)) ||
       (iVar6 = basic_substring<const_char>::compare(&local_50,"null",4), iVar6 == 0)) ||
      ((bVar4 = basic_substring<const_char>::is_number(&local_50), bVar4 &&
       (((local_50.len < 2 || (*local_50.str != '0')) ||
        (sVar10 = basic_substring<const_char>::first_of(&local_50,'.',0),
        sVar10 != 0xffffffffffffffff)))))))) {
    sVar10 = local_50.len;
    if (local_50.str == (char *)0x0 || local_50.len == 0) {
      return;
    }
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),(long)local_50.str);
  }
  else {
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    psVar11 = &(this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).m_pos;
    *psVar11 = *psVar11 + 1;
    psVar11 = &(this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).m_pos;
    if (local_50.len == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      uVar7 = 0;
      do {
        cVar2 = local_50.str[uVar7];
        switch(cVar2) {
        case '\b':
          if (local_50.len < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar7 < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar7) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring(&local_40,local_50.str + uVar9,uVar7 - uVar9)
          ;
          sVar10 = local_40.len;
          pcVar8 = "\\b";
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)((this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + 0x10),(long)local_40.str);
            pcVar8 = "\\b";
LAB_001e2a17:
            *psVar11 = *psVar11 + sVar10;
          }
          break;
        case '\t':
          if (local_50.len < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar7 < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar7) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring(&local_40,local_50.str + uVar9,uVar7 - uVar9)
          ;
          sVar10 = local_40.len;
          pcVar8 = "\\t";
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)((this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + 0x10),(long)local_40.str);
            pcVar8 = "\\t";
            goto LAB_001e2a17;
          }
          break;
        case '\n':
          if (local_50.len < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar7 < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar7) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring(&local_40,local_50.str + uVar9,uVar7 - uVar9)
          ;
          sVar10 = local_40.len;
          pcVar8 = "\\n";
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)((this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + 0x10),(long)local_40.str);
            pcVar8 = "\\n";
            goto LAB_001e2a17;
          }
          break;
        case '\v':
          goto switchD_001e26c7_caseD_b;
        case '\f':
          if (local_50.len < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar7 < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar7) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring(&local_40,local_50.str + uVar9,uVar7 - uVar9)
          ;
          sVar10 = local_40.len;
          pcVar8 = "\\f";
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)((this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + 0x10),(long)local_40.str);
            pcVar8 = "\\f";
            goto LAB_001e2a17;
          }
          break;
        case '\r':
          if (local_50.len < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar7 < uVar9) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar7) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            handle_error(0x250c0a,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring(&local_40,local_50.str + uVar9,uVar7 - uVar9)
          ;
          sVar10 = local_40.len;
          pcVar8 = "\\r";
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)((this->
                                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ).m_stream + 0x10),(long)local_40.str);
            pcVar8 = "\\r";
            goto LAB_001e2a17;
          }
          break;
        default:
          if (cVar2 == '\\') {
            if (local_50.len < uVar9) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            if (uVar7 < uVar9) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (local_50.len < uVar7) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_40,local_50.str + uVar9,uVar7 - uVar9);
            sVar10 = local_40.len;
            pcVar8 = "\\\\";
            if (local_40.str != (char *)0x0 && local_40.len != 0) {
              std::ostream::write((char *)((this->
                                           super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ).m_stream + 0x10),(long)local_40.str);
              pcVar8 = "\\\\";
              goto LAB_001e2a17;
            }
          }
          else {
            if (cVar2 != '\"') goto switchD_001e26c7_caseD_b;
            if (local_50.len < uVar9) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            if (uVar7 < uVar9) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (local_50.len < uVar7) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              handle_error(0x250c0a,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_40,local_50.str + uVar9,uVar7 - uVar9);
            sVar10 = local_40.len;
            pcVar8 = "\\\"";
            if (local_40.str != (char *)0x0 && local_40.len != 0) {
              std::ostream::write((char *)((this->
                                           super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ).m_stream + 0x10),(long)local_40.str);
              pcVar8 = "\\\"";
              goto LAB_001e2a17;
            }
          }
        }
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)pcVar8);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 2;
        uVar9 = uVar7 + 1;
switchD_001e26c7_caseD_b:
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_50.len);
    }
    if ((uVar9 < local_50.len) &&
       (basic_substring<const_char>::basic_substring
                  (&local_40,local_50.str + uVar9,local_50.len - uVar9),
       local_40.str != (char *)0x0 && local_40.len != 0)) {
      std::ostream::write((char *)((this->
                                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).m_stream + 0x10),(long)local_40.str);
      psVar11 = &(this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).m_pos;
      *psVar11 = *psVar11 + local_40.len;
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream + '\x10');
    sVar10 = 1;
  }
  psVar11 = &(this->
             super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).m_pos;
  *psVar11 = *psVar11 + sVar10;
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_json(csubstr s, bool as_key, bool use_quotes)
{
    if((!use_quotes)
       // json keys require quotes
       && (!as_key)
       && (
           // do not quote special cases
           (s == "true" || s == "false" || s == "null")
           || (
               // do not quote numbers
               (s.is_number()
                && (
                    // quote integral numbers if they have a leading 0
                    // https://github.com/biojppm/rapidyaml/issues/291
                    (!(s.len > 1 && s.begins_with('0')))
                    // do not quote reals with leading 0
                    // https://github.com/biojppm/rapidyaml/issues/313
                    || (s.find('.') != csubstr::npos) ))
               )
           )
        )
    {
        this->Writer::_do_write(s);
    }
    else
    {
        size_t pos = 0;
        this->Writer::_do_write('"');
        for(size_t i = 0; i < s.len; ++i)
        {
            switch(s.str[i])
            {
            case '"':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\"");
              pos = i + 1;
              break;
            case '\n':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\n");
              pos = i + 1;
              break;
            case '\t':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\t");
              pos = i + 1;
              break;
            case '\\':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\\");
              pos = i + 1;
              break;
            case '\r':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\r");
              pos = i + 1;
              break;
            case '\b':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\b");
              pos = i + 1;
              break;
            case '\f':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\f");
              pos = i + 1;
              break;
            }
        }
        if(pos < s.len)
        {
            csubstr sub = s.sub(pos);
            this->Writer::_do_write(sub);
        }
        this->Writer::_do_write('"');
    }
}